

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress3.c
# Opt level: O2

void Abc_NtkCollectAddOne
               (int iNtk,int iObj,int iGiaLit,Gia_Man_t *pGia,Vec_Int_t *vGia2Cla,Vec_Int_t **vNexts
               )

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  int Entry;
  Gia_Obj_t *pGVar4;
  uint v;
  
  uVar2 = Abc_Lit2Var(iGiaLit);
  v = (uint)pGia->pReprs[uVar2] & 0xfffffff;
  if (v == 0xfffffff) {
    v = uVar2;
  }
  uVar2 = Abc_LitIsCompl(iGiaLit);
  pGVar4 = Gia_ManObj(pGia,v);
  uVar1 = *(undefined8 *)pGVar4;
  iVar3 = Abc_Lit2Var(iGiaLit);
  pGVar4 = Gia_ManObj(pGia,iVar3);
  iVar3 = Abc_Var2Lit(iObj,(uint)((ulong)*(undefined8 *)pGVar4 >> 0x3f) ^ uVar2 ^
                           (uint)((ulong)uVar1 >> 0x3f));
  iVar3 = Abc_Var2Lit(iVar3,iNtk);
  Entry = Vec_IntEntry(vGia2Cla,v);
  Vec_IntWriteEntry(vNexts[(uint)iNtk],iObj,Entry);
  Vec_IntWriteEntry(vGia2Cla,v,iVar3);
  return;
}

Assistant:

static inline void Abc_NtkCollectAddOne( int iNtk, int iObj, int iGiaLit, Gia_Man_t * pGia, Vec_Int_t * vGia2Cla, Vec_Int_t * vNexts[2] )
{
    int iRepr = Gia_ObjReprSelf( pGia, Abc_Lit2Var(iGiaLit) );
    int Compl = Abc_LitIsCompl(iGiaLit) ^ Gia_ObjPhase(Gia_ManObj(pGia, iRepr)) ^ Gia_ObjPhase(Gia_ManObj(pGia, Abc_Lit2Var(iGiaLit)));
    int Added = Abc_Var2Lit( Abc_Var2Lit(iObj, Compl), iNtk );
    int Entry = Vec_IntEntry( vGia2Cla, iRepr );
    Vec_IntWriteEntry( vNexts[iNtk], iObj, Entry );
    Vec_IntWriteEntry( vGia2Cla, iRepr, Added );
}